

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O1

int SoapySDRRateTest(string *argStr,double sampleRate,string *formatStr,string *channelStr,
                    string *directionStr)

{
  _Rb_tree_node_base *p_Var1;
  pointer pcVar2;
  unsigned_long *puVar3;
  int iVar4;
  Device *pDVar5;
  int *piVar6;
  long lVar7;
  undefined8 uVar8;
  size_t elemSize;
  Stream *stream;
  ostream *poVar9;
  invalid_argument *this;
  unsigned_long *chan;
  unsigned_long *puVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channels;
  double fullScale;
  string format;
  int local_cc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  Device *local_b0;
  unsigned_long local_a8;
  double local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Rb_tree_node_base *local_58;
  size_t sStack_50;
  string *local_40;
  string *local_38;
  
  local_a0 = sampleRate;
  local_38 = formatStr;
  pDVar5 = (Device *)SoapySDR::Device::make((string *)argStr);
  iVar4 = std::__cxx11::string::compare((char *)directionStr);
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)directionStr);
    local_cc = -1;
    if (iVar4 != 0) goto LAB_0010bdcc;
  }
  local_cc = 1;
LAB_0010bdcc:
  iVar4 = std::__cxx11::string::compare((char *)directionStr);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)directionStr), iVar4 == 0)) {
    local_cc = 0;
  }
  local_b0 = pDVar5;
  if (local_cc != -1) {
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_40 = directionStr;
    SoapySDR::KwargsFromString((string *)local_78);
    p_Var1 = (_Rb_tree_node_base *)(local_78 + 8);
    if ((_Rb_tree_node_base *)local_68._8_8_ != p_Var1) {
      piVar6 = __errno_location();
      uVar8 = local_68._8_8_;
      do {
        directionStr = *(string **)(uVar8 + 0x20);
        iVar4 = *piVar6;
        *piVar6 = 0;
        lVar7 = strtol((char *)directionStr,(char **)&local_98,10);
        if (local_98 == directionStr) {
          std::__throw_invalid_argument("stoi");
LAB_0010c240:
          std::__throw_out_of_range("stoi");
          goto LAB_0010c24c;
        }
        if (((int)lVar7 != lVar7) || (*piVar6 == 0x22)) goto LAB_0010c240;
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        local_a8 = (unsigned_long)(int)lVar7;
        if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_c8,
                     (iterator)
                     local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_a8);
        }
        else {
          *local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_a8;
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar8);
      } while ((_Rb_tree_node_base *)uVar8 != p_Var1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_78);
    pDVar5 = local_b0;
    puVar10 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_78._0_8_ = 0;
      if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_78);
        puVar10 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
        puVar3 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = 0;
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        puVar3 = local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
    }
    for (; puVar10 != puVar3; puVar10 = puVar10 + 1) {
      (**(code **)(*(long *)pDVar5 + 0x1f8))(local_a0,pDVar5,local_cc,*puVar10);
    }
    local_a8 = 0;
    if (local_38->_M_string_length == 0) {
      (**(code **)(*(long *)pDVar5 + 0x58))
                (&local_98,pDVar5,local_cc,
                 *local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,&local_a8);
    }
    else {
      local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
      pcVar2 = (local_38->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar2,pcVar2 + local_38->_M_string_length);
    }
    elemSize = SoapySDR::formatToSize((string *)&local_98);
    local_68._M_allocated_capacity = 0;
    local_78._0_8_ = 0;
    local_78._8_8_ = 0;
    sStack_50 = 0;
    local_68._8_8_ = p_Var1;
    local_58 = p_Var1;
    stream = (Stream *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,local_cc,&local_98,&local_c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stream format: ",0xf);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_98,local_90);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Num channels: ",0xe);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Element size: ",0xe);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Begin ",6);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(local_40->_M_dataplus)._M_p,
                        local_40->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," rate test at ",0xe);
    poVar9 = std::ostream::_M_insert<double>(local_a0 / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," Msps",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    runRateTestStreamLoop
              (pDVar5,stream,local_cc,
               (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,elemSize);
    (**(code **)(*(long *)pDVar5 + 0x70))(pDVar5,stream);
    SoapySDR::Device::unmake(pDVar5);
    if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
      operator_delete(local_98);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return 1;
  }
LAB_0010c24c:
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 "direction not in RX/TX: ",directionStr);
  std::invalid_argument::invalid_argument(this,(string *)local_78);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int SoapySDRRateTest(
    const std::string &argStr,
    const double sampleRate,
    const std::string &formatStr,
    const std::string &channelStr,
    const std::string &directionStr)
{
    SoapySDR::Device *device(nullptr);

    try
    {
        device = SoapySDR::Device::make(argStr);

        //parse the direction to the integer enum
        int direction(-1);
        if (directionStr == "RX" or directionStr == "rx") direction = SOAPY_SDR_RX;
        if (directionStr == "TX" or directionStr == "tx") direction = SOAPY_SDR_TX;
        if (direction == -1) throw std::invalid_argument("direction not in RX/TX: " + directionStr);

        //build channels list, using KwargsFromString is a easy parsing hack
        std::vector<size_t> channels;
        for (const auto &pair : SoapySDR::KwargsFromString(channelStr))
        {
            channels.push_back(std::stoi(pair.first));
        }
        if (channels.empty()) channels.push_back(0);

        //initialize the sample rate for all channels
        for (const auto &chan : channels)
        {
            device->setSampleRate(direction, chan, sampleRate);
        }

        //create the stream, use the native format
        double fullScale(0.0);
        const auto format = formatStr.empty() ? device->getNativeStreamFormat(direction, channels.front(), fullScale) : formatStr;
        const size_t elemSize = SoapySDR::formatToSize(format);
        auto stream = device->setupStream(direction, format, channels);

        //run the rate test one setup is complete
        std::cout << "Stream format: " << format << std::endl;
        std::cout << "Num channels: " << channels.size() << std::endl;
        std::cout << "Element size: " << elemSize << " bytes" << std::endl;
        std::cout << "Begin " << directionStr << " rate test at " << (sampleRate/1e6) << " Msps" << std::endl;
        runRateTestStreamLoop(device, stream, direction, channels.size(), elemSize);

        //cleanup stream and device
        device->closeStream(stream);
        SoapySDR::Device::unmake(device);
    }
    catch (const std::exception &ex)
    {
        std::cerr << "Error in rate test: " << ex.what() << std::endl;
        SoapySDR::Device::unmake(device);
        return EXIT_FAILURE;
    }
    return EXIT_FAILURE;
}